

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O2

void can_create_markers_for_mixed_parameters(void)

{
  byte bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  byte *pbVar4;
  undefined1 *puVar5;
  int iVar6;
  undefined8 uVar7;
  
  uVar7 = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
  iVar6 = cgreen_vector_size(uVar7);
  uVar3 = create_equal_to_value_constraint(5,"5");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x93,"cgreen_vector_size(markers)",(long)iVar6,uVar3);
  pbVar4 = (byte *)cgreen_vector_get(uVar7,0);
  bVar1 = *pbVar4;
  uVar3 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x94,"!*(_Bool*)cgreen_vector_get(markers, 0)",bVar1 ^ 1,uVar3);
  puVar5 = (undefined1 *)cgreen_vector_get(uVar7,1);
  uVar2 = *puVar5;
  uVar3 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x95,"*(_Bool*)cgreen_vector_get(markers, 1)",uVar2,uVar3);
  pbVar4 = (byte *)cgreen_vector_get(uVar7,2);
  bVar1 = *pbVar4;
  uVar3 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x96,"!*(_Bool*)cgreen_vector_get(markers, 2)",bVar1 ^ 1,uVar3);
  pbVar4 = (byte *)cgreen_vector_get(uVar7,3);
  bVar1 = *pbVar4;
  uVar3 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x97,"!*(_Bool*)cgreen_vector_get(markers, 3)",bVar1 ^ 1,uVar3);
  puVar5 = (undefined1 *)cgreen_vector_get(uVar7,4);
  uVar2 = *puVar5;
  uVar3 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x98,"*(_Bool*)cgreen_vector_get(markers, 4)",uVar2,uVar3);
  destroy_cgreen_vector(uVar7);
  return;
}

Assistant:

Ensure(can_create_markers_for_mixed_parameters) {
    CgreenVector *markers = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
    assert_that(cgreen_vector_size(markers), is_equal_to(5));
    assert_that(!*(bool*)cgreen_vector_get(markers, 0));
    assert_that(*(bool*)cgreen_vector_get(markers, 1));
    assert_that(!*(bool*)cgreen_vector_get(markers, 2));
    assert_that(!*(bool*)cgreen_vector_get(markers, 3));
    assert_that(*(bool*)cgreen_vector_get(markers, 4));
    destroy_cgreen_vector(markers);
}